

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

TonkResult tonk_set_default_socket_config(uint32_t tonk_version,TonkSocketConfig *configOut)

{
  void *in_RSI;
  int in_EDI;
  TonkSocketConfig_t TStack_88;
  void *local_10;
  TonkResult local_4;
  
  if ((in_RSI == (void *)0x0) || (in_EDI != 9)) {
    local_4 = Tonk_InvalidInput;
  }
  else {
    local_10 = in_RSI;
    memset(&TStack_88,0,0x78);
    TonkSocketConfig_t::TonkSocketConfig_t(&TStack_88);
    memcpy(local_10,&TStack_88,0x78);
    local_4 = Tonk_Success;
  }
  return local_4;
}

Assistant:

TONK_EXPORT TonkResult tonk_set_default_socket_config(
    uint32_t tonk_version,
    TonkSocketConfig* configOut)
{
    // NOTE: We cannot use the logger in this code path because it may have
    // been shutdown.

    if (!configOut || tonk_version != TONK_VERSION)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    *configOut = TonkSocketConfig();
    return Tonk_Success;
}